

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_client.c
# Opt level: O2

int main(void)

{
  char *custom;
  int iVar1;
  size_t len;
  mbedtls_net_context server_fd;
  sockaddr local_ad8;
  mbedtls_ssl_context ssl;
  mbedtls_ssl_config conf;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_x509_crt ca;
  mbedtls_entropy_context entropy;
  
  mbedtls_ctr_drbg_init(&ctr_drbg);
  mbedtls_net_init(&server_fd);
  mbedtls_ssl_init(&ssl);
  mbedtls_ssl_config_init(&conf);
  mbedtls_x509_crt_init(&ca);
  mbedtls_entropy_init(&entropy);
  custom = pers;
  len = strlen(pers);
  iVar1 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)custom,len);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ssl_config_defaults(&conf,0,0,0);
    if (iVar1 == 0) {
      mbedtls_ssl_conf_rng(&conf,mbedtls_ctr_drbg_random,&ctr_drbg);
      mbedtls_ssl_conf_psk(&conf,"",0x10,(uchar *)"Client_identity",0xf);
      iVar1 = mbedtls_x509_crt_parse_der(&ca,ca_cert,0x256);
      if (iVar1 == 0) {
        mbedtls_ssl_conf_ca_chain(&conf,&ca,(mbedtls_x509_crl *)0x0);
        mbedtls_ssl_conf_authmode(&conf,2);
        iVar1 = mbedtls_ssl_setup(&ssl,&conf);
        if (iVar1 == 0) {
          iVar1 = mbedtls_ssl_set_hostname(&ssl,"localhost");
          if (iVar1 == 0) {
            local_ad8.sa_data[6] = '\0';
            local_ad8.sa_data[7] = '\0';
            local_ad8.sa_data[8] = '\0';
            local_ad8.sa_data[9] = '\0';
            local_ad8.sa_data[10] = '\0';
            local_ad8.sa_data[0xb] = '\0';
            local_ad8.sa_data[0xc] = '\0';
            local_ad8.sa_data[0xd] = '\0';
            local_ad8.sa_family = 2;
            builtin_strncpy(local_ad8.sa_data,"\x11Q\x7f",4);
            local_ad8.sa_data[4] = '\0';
            local_ad8.sa_data[5] = '\x01';
            server_fd.fd = socket(2,1,0);
            if (server_fd.fd < 0) {
              iVar1 = 5;
            }
            else {
              iVar1 = connect(server_fd.fd,&local_ad8,0x10);
              if (iVar1 < 0) {
                iVar1 = 6;
              }
              else {
                mbedtls_ssl_set_bio(&ssl,&server_fd,mbedtls_net_send,mbedtls_net_recv,
                                    (mbedtls_ssl_recv_timeout_t *)0x0);
                iVar1 = mbedtls_ssl_handshake(&ssl);
                if (iVar1 == 0) {
                  iVar1 = mbedtls_ssl_write(&ssl,(uchar *)"GET / HTTP/1.0\r\n\r\n",0x12);
                  if (iVar1 < 1) {
                    iVar1 = 9;
                  }
                  else {
                    mbedtls_ssl_close_notify(&ssl);
                    iVar1 = 0;
                  }
                }
                else {
                  iVar1 = 8;
                }
              }
            }
          }
          else {
            iVar1 = 4;
          }
        }
        else {
          iVar1 = 3;
        }
      }
      else {
        iVar1 = 7;
      }
    }
    else {
      iVar1 = 2;
    }
  }
  else {
    iVar1 = 1;
  }
  mbedtls_net_free(&server_fd);
  mbedtls_ssl_free(&ssl);
  mbedtls_ssl_config_free(&conf);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  mbedtls_x509_crt_free(&ca);
  return iVar1;
}

Assistant:

int main( void )
{
    int ret = exit_ok;
    mbedtls_net_context server_fd;
    struct sockaddr_in addr;
#if defined(MBEDTLS_X509_CRT_PARSE_C)
    mbedtls_x509_crt ca;
#endif

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * 0. Initialize and setup stuff
     */
    mbedtls_net_init( &server_fd );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
#if defined(MBEDTLS_X509_CRT_PARSE_C)
    mbedtls_x509_crt_init( &ca );
#endif

    mbedtls_entropy_init( &entropy );
    if( mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                       (const unsigned char *) pers, strlen( pers ) ) != 0 )
    {
        ret = ctr_drbg_seed_failed;
        goto exit;
    }

    if( mbedtls_ssl_config_defaults( &conf,
                MBEDTLS_SSL_IS_CLIENT,
                MBEDTLS_SSL_TRANSPORT_STREAM,
                MBEDTLS_SSL_PRESET_DEFAULT ) != 0 )
    {
        ret = ssl_config_defaults_failed;
        goto exit;
    }

    mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    mbedtls_ssl_conf_psk( &conf, psk, sizeof( psk ),
                (const unsigned char *) psk_id, sizeof( psk_id ) - 1 );
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( mbedtls_x509_crt_parse_der( &ca, ca_cert, sizeof( ca_cert ) ) != 0 )
    {
        ret = x509_crt_parse_failed;
        goto exit;
    }

    mbedtls_ssl_conf_ca_chain( &conf, &ca, NULL );
    mbedtls_ssl_conf_authmode( &conf, MBEDTLS_SSL_VERIFY_REQUIRED );
#endif

    if( mbedtls_ssl_setup( &ssl, &conf ) != 0 )
    {
        ret = ssl_setup_failed;
        goto exit;
    }

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( mbedtls_ssl_set_hostname( &ssl, HOSTNAME ) != 0 )
    {
        ret = hostname_failed;
        goto exit;
    }
#endif

    /*
     * 1. Start the connection
     */
    memset( &addr, 0, sizeof( addr ) );
    addr.sin_family = AF_INET;

    ret = 1; /* for endianness detection */
    addr.sin_port = *((char *) &ret) == ret ? PORT_LE : PORT_BE;
    addr.sin_addr.s_addr = *((char *) &ret) == ret ? ADDR_LE : ADDR_BE;
    ret = 0;

    if( ( server_fd.fd = socket( AF_INET, SOCK_STREAM, 0 ) ) < 0 )
    {
        ret = socket_failed;
        goto exit;
    }

    if( connect( server_fd.fd,
                (const struct sockaddr *) &addr, sizeof( addr ) ) < 0 )
    {
        ret = connect_failed;
        goto exit;
    }

    mbedtls_ssl_set_bio( &ssl, &server_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

    if( mbedtls_ssl_handshake( &ssl ) != 0 )
    {
        ret = ssl_handshake_failed;
        goto exit;
    }

    /*
     * 2. Write the GET request and close the connection
     */
    if( mbedtls_ssl_write( &ssl, (const unsigned char *) GET_REQUEST,
                         sizeof( GET_REQUEST ) - 1 ) <= 0 )
    {
        ret = ssl_write_failed;
        goto exit;
    }

    mbedtls_ssl_close_notify( &ssl );

exit:
    mbedtls_net_free( &server_fd );

    mbedtls_ssl_free( &ssl );
    mbedtls_ssl_config_free( &conf );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );
#if defined(MBEDTLS_X509_CRT_PARSE_C)
    mbedtls_x509_crt_free( &ca );
#endif

    return( ret );
}